

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O3

int ncnn::
    reduction<ncnn::reduction_op_asum<float>,std::plus<float>,ncnn::post_process_identity<float>>
              (Mat *a,Mat *b,float v0,bool reduce_w,bool reduce_h,bool reduce_c,bool post_process,
              float coeff,int keepdims,Option *opt)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  long *plVar5;
  bool bVar6;
  int i_1;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  void *pvVar11;
  Mat *pMVar12;
  Mat *pMVar13;
  long lVar14;
  undefined7 in_register_00000011;
  void *pvVar15;
  Mat *pMVar16;
  Mat *pMVar17;
  byte bVar18;
  char cVar19;
  Mat *pMVar20;
  undefined7 in_register_00000081;
  bool bVar21;
  undefined7 in_register_00000089;
  ulong uVar22;
  void *pvVar23;
  ulong uVar24;
  Mat *pMVar25;
  uint uVar26;
  uint uVar27;
  int *piVar28;
  float fVar29;
  undefined4 in_stack_0000000c;
  void *ptr;
  Mat local_78;
  
  lVar14 = CONCAT44(in_stack_0000000c,keepdims);
  sVar1 = a->elemsize;
  iVar9 = a->dims;
  pMVar20 = b;
  if ((int)CONCAT71(in_register_00000089,post_process) == 0) {
    if (iVar9 == 3) {
      uVar10 = a->w;
      lVar14 = (long)(int)uVar10;
      uVar7 = a->h;
      uVar22 = (ulong)uVar7;
      uVar26 = a->c;
      pMVar17 = (Mat *)(long)(int)uVar26;
      uVar27 = uVar7 * uVar10;
      bVar21 = !reduce_w;
      bVar6 = !reduce_h;
      pMVar20 = (Mat *)(CONCAT71(in_register_00000081,reduce_c) & 0xffffffff ^ 1);
      cVar19 = (char)pMVar20;
      if ((bVar21 || bVar6) || cVar19 != '\0') {
        if ((!bVar21 && !bVar6) && !reduce_c) {
          pMVar20 = (Mat *)(ulong)uVar26;
          Mat::create(b,uVar26,sVar1,*(Allocator **)(CONCAT44(in_stack_0000000c,keepdims) + 8));
          if (0 < (int)uVar26) {
            pvVar11 = a->data;
            sVar1 = a->elemsize;
            sVar2 = a->cstep;
            pvVar15 = b->data;
            pMVar20 = (Mat *)(ulong)uVar27;
            pMVar13 = (Mat *)0x0;
            do {
              fVar29 = 0.0;
              if (0 < (int)uVar27) {
                pMVar12 = (Mat *)0x0;
                do {
                  fVar29 = fVar29 + ABS(*(float *)((long)pvVar11 + (long)pMVar12 * 4));
                  pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                } while (pMVar20 != pMVar12);
              }
              *(float *)((long)pvVar15 + (long)pMVar13 * 4) = fVar29;
              pMVar13 = (Mat *)((long)&pMVar13->data + 1);
              pvVar11 = (void *)((long)pvVar11 + sVar1 * sVar2);
            } while (pMVar13 != pMVar17);
          }
          goto LAB_0014ba5a;
        }
        pMVar13 = (Mat *)(ulong)uVar10;
        if ((!bVar21 && !reduce_h) && !reduce_c) {
          pMVar20 = (Mat *)(ulong)uVar7;
          Mat::create(b,uVar7,uVar26,sVar1,*(Allocator **)(CONCAT44(in_stack_0000000c,keepdims) + 8)
                     );
          if (0 < (int)uVar26) {
            pvVar11 = a->data;
            sVar1 = a->elemsize;
            pvVar15 = b->data;
            pMVar20 = (Mat *)((long)b->w * b->elemsize);
            sVar2 = a->cstep;
            pMVar12 = (Mat *)0x0;
            do {
              if (0 < (int)uVar7) {
                uVar24 = 0;
                pvVar23 = pvVar11;
                do {
                  fVar29 = 0.0;
                  if (0 < (int)uVar10) {
                    pMVar16 = (Mat *)0x0;
                    do {
                      fVar29 = fVar29 + ABS(*(float *)((long)pvVar23 + (long)pMVar16 * 4));
                      pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                    } while (pMVar13 != pMVar16);
                  }
                  *(float *)((long)pvVar15 + uVar24 * 4 + (long)pMVar20 * (long)pMVar12) = fVar29;
                  uVar24 = uVar24 + 1;
                  pvVar23 = (void *)((long)pvVar23 + lVar14 * 4);
                } while (uVar24 != uVar22);
              }
              pMVar12 = (Mat *)((long)&pMVar12->data + 1);
              pvVar11 = (void *)((long)pvVar11 + sVar1 * sVar2);
            } while (pMVar12 != pMVar17);
          }
          goto LAB_0014ba5a;
        }
        if ((bVar21 || reduce_h) || cVar19 != '\0') {
          if ((bVar6 || reduce_w) || cVar19 != '\0') {
            if ((reduce_w || reduce_h) || cVar19 != '\0') {
              if ((!bVar6 && !reduce_w) && !reduce_c) {
                pMVar20 = (Mat *)(ulong)uVar10;
                Mat::create(b,uVar10,uVar26,sVar1,
                            *(Allocator **)(CONCAT44(in_stack_0000000c,keepdims) + 8));
                uVar27 = b->c * (int)b->cstep;
                if (0 < (int)uVar27) {
                  pMVar20 = (Mat *)0x0;
                  memset(b->data,0,(ulong)uVar27 << 2);
                }
                if (0 < (int)uVar26) {
                  pvVar11 = a->data;
                  sVar1 = a->elemsize;
                  pvVar15 = b->data;
                  pMVar20 = (Mat *)((long)b->w * b->elemsize);
                  sVar2 = a->cstep;
                  pMVar12 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar7) {
                      uVar26 = 0;
                      pvVar23 = pvVar11;
                      do {
                        if (0 < (int)uVar10) {
                          pMVar16 = (Mat *)0x0;
                          do {
                            *(float *)((long)pvVar15 + (long)pMVar16 * 4) =
                                 ABS(*(float *)((long)pvVar23 + (long)pMVar16 * 4)) +
                                 *(float *)((long)pvVar15 + (long)pMVar16 * 4);
                            pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                          } while (pMVar13 != pMVar16);
                        }
                        uVar26 = uVar26 + 1;
                        pvVar23 = (void *)((long)pvVar23 + (long)(int)uVar10 * 4);
                      } while (uVar26 != uVar7);
                    }
                    pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                    pvVar11 = (void *)((long)pvVar11 + sVar1 * sVar2);
                    pvVar15 = (void *)((long)&pMVar20->data + (long)pvVar15);
                  } while (pMVar12 != pMVar17);
                }
              }
            }
            else {
              Mat::create(b,uVar10,uVar7,sVar1,
                          *(Allocator **)(CONCAT44(in_stack_0000000c,keepdims) + 8));
              uVar10 = b->c * (int)b->cstep;
              if (0 < (int)uVar10) {
                pMVar13 = (Mat *)0x0;
                memset(b->data,0,(ulong)uVar10 << 2);
              }
              pMVar20 = pMVar13;
              if (0 < (int)uVar26) {
                pvVar11 = a->data;
                sVar1 = a->elemsize;
                sVar2 = a->cstep;
                pvVar15 = b->data;
                pMVar20 = (Mat *)(ulong)uVar27;
                pMVar13 = (Mat *)0x0;
                do {
                  if (0 < (int)uVar27) {
                    pMVar12 = (Mat *)0x0;
                    do {
                      *(float *)((long)pvVar15 + (long)pMVar12 * 4) =
                           ABS(*(float *)((long)pvVar11 + (long)pMVar12 * 4)) +
                           *(float *)((long)pvVar15 + (long)pMVar12 * 4);
                      pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                    } while (pMVar20 != pMVar12);
                  }
                  pMVar13 = (Mat *)((long)&pMVar13->data + 1);
                  pvVar11 = (void *)((long)pvVar11 + sVar1 * sVar2);
                } while (pMVar13 != pMVar17);
              }
            }
            goto LAB_0014ba5a;
          }
          Mat::create(b,uVar10,sVar1,*(Allocator **)(CONCAT44(in_stack_0000000c,keepdims) + 8));
          local_78.elemsize._0_4_ = 0;
          local_78.elemsize._4_4_ = 0;
          local_78.elempack = 0;
          local_78.data = (Mat *)0x0;
          local_78.refcount._0_4_ = 0;
          local_78.refcount._4_4_ = 0;
          local_78.allocator = (Allocator *)0x0;
          local_78.dims = 0;
          local_78.w = 0;
          local_78.h = 0;
          local_78.c = 0;
          local_78.cstep = 0;
          Mat::create(&local_78,uVar10,1,uVar26,sVar1,
                      *(Allocator **)(CONCAT44(in_stack_0000000c,keepdims) + 0x10));
          sVar1 = local_78.cstep;
          pMVar20 = (Mat *)local_78.data;
          pMVar12 = (Mat *)0xffffff9c;
          if (((Mat *)local_78.data != (Mat *)0x0) && (local_78.cstep * (long)local_78.c != 0)) {
            uVar27 = (int)local_78.cstep * local_78.c;
            if (0 < (int)uVar27) {
              memset(local_78.data,0,(ulong)uVar27 << 2);
            }
            if (0 < (int)uVar26) {
              pvVar11 = a->data;
              sVar2 = a->elemsize;
              sVar3 = a->cstep;
              pMVar16 = (Mat *)0x0;
              pMVar12 = pMVar20;
              do {
                if (0 < (int)uVar7) {
                  uVar27 = 0;
                  pvVar15 = pvVar11;
                  do {
                    if (0 < (int)uVar10) {
                      pMVar25 = (Mat *)0x0;
                      do {
                        *(float *)((long)&pMVar12->data + (long)pMVar25 * 4) =
                             ABS(*(float *)((long)pvVar15 + (long)pMVar25 * 4)) +
                             *(float *)((long)&pMVar12->data + (long)pMVar25 * 4);
                        pMVar25 = (Mat *)((long)&pMVar25->data + 1);
                      } while (pMVar13 != pMVar25);
                    }
                    uVar27 = uVar27 + 1;
                    pvVar15 = (void *)((long)pvVar15 + lVar14 * 4);
                  } while (uVar27 != uVar7);
                }
                pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                pvVar11 = (void *)((long)pvVar11 + sVar2 * sVar3);
                pMVar12 = (Mat *)((long)&pMVar12->data +
                                 CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize) *
                                 sVar1);
              } while (pMVar16 != pMVar17);
            }
            uVar7 = b->c * (int)b->cstep;
            if (0 < (int)uVar7) {
              memset(b->data,0,(ulong)uVar7 << 2);
            }
            if (0 < (int)uVar26) {
              pvVar11 = b->data;
              pMVar12 = (Mat *)0x0;
              do {
                if (0 < (int)uVar10) {
                  pMVar16 = (Mat *)0x0;
                  do {
                    *(float *)((long)pvVar11 + (long)pMVar16 * 4) =
                         *(float *)((long)&pMVar20->data + (long)pMVar16 * 4) +
                         *(float *)((long)pvVar11 + (long)pMVar16 * 4);
                    pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                  } while (pMVar13 != pMVar16);
                }
                pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                pMVar20 = (Mat *)((long)&pMVar20->data +
                                 sVar1 * CONCAT44(local_78.elemsize._4_4_,
                                                  (undefined4)local_78.elemsize));
              } while (pMVar12 != pMVar17);
            }
            goto LAB_0014c8ff;
          }
        }
        else {
          Mat::create(b,uVar7,sVar1,*(Allocator **)(CONCAT44(in_stack_0000000c,keepdims) + 8));
          local_78.elemsize._0_4_ = 0;
          local_78.elemsize._4_4_ = 0;
          local_78.elempack = 0;
          local_78.data = (Mat *)0x0;
          local_78.refcount._0_4_ = 0;
          local_78.refcount._4_4_ = 0;
          local_78.allocator = (Allocator *)0x0;
          local_78.dims = 0;
          local_78.w = 0;
          local_78.h = 0;
          local_78.c = 0;
          local_78.cstep = 0;
          Mat::create(&local_78,1,uVar7,uVar26,sVar1,
                      *(Allocator **)(CONCAT44(in_stack_0000000c,keepdims) + 0x10));
          sVar1 = local_78.cstep;
          pMVar20 = (Mat *)local_78.data;
          pMVar12 = (Mat *)0xffffff9c;
          if (((Mat *)local_78.data != (Mat *)0x0) && (local_78.cstep * (long)local_78.c != 0)) {
            uVar27 = (int)local_78.cstep * local_78.c;
            if (0 < (int)uVar27) {
              memset(local_78.data,0,(ulong)uVar27 << 2);
            }
            if (0 < (int)uVar26) {
              pvVar11 = a->data;
              sVar2 = a->elemsize;
              sVar3 = a->cstep;
              pMVar12 = (Mat *)0x0;
              do {
                if (0 < (int)uVar7) {
                  uVar24 = 0;
                  pvVar15 = pvVar11;
                  do {
                    fVar29 = 0.0;
                    if (0 < (int)uVar10) {
                      pMVar16 = (Mat *)0x0;
                      do {
                        fVar29 = fVar29 + ABS(*(float *)((long)pvVar15 + (long)pMVar16 * 4));
                        pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                      } while (pMVar13 != pMVar16);
                    }
                    *(float *)((long)&pMVar20->data +
                              uVar24 * 4 +
                              CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize) *
                              sVar1 * (long)pMVar12) = fVar29;
                    uVar24 = uVar24 + 1;
                    pvVar15 = (void *)((long)pvVar15 + lVar14 * 4);
                  } while (uVar24 != uVar22);
                }
                pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                pvVar11 = (void *)((long)pvVar11 + sVar2 * sVar3);
              } while (pMVar12 != pMVar17);
            }
            uVar10 = b->c * (int)b->cstep;
            if (0 < (int)uVar10) {
              memset(b->data,0,(ulong)uVar10 << 2);
            }
            if (0 < (int)uVar26) {
              pvVar11 = b->data;
              pMVar13 = (Mat *)0x0;
              do {
                if (0 < (int)uVar7) {
                  uVar24 = 0;
                  do {
                    *(float *)((long)pvVar11 + uVar24 * 4) =
                         *(float *)((long)&pMVar20->data + uVar24 * 4) +
                         *(float *)((long)pvVar11 + uVar24 * 4);
                    uVar24 = uVar24 + 1;
                  } while (uVar22 != uVar24);
                }
                pMVar13 = (Mat *)((long)&pMVar13->data + 1);
                pMVar20 = (Mat *)((long)&pMVar20->data +
                                 sVar1 * CONCAT44(local_78.elemsize._4_4_,
                                                  (undefined4)local_78.elemsize));
              } while (pMVar13 != pMVar17);
            }
            goto LAB_0014c8ff;
          }
        }
        goto LAB_0014c901;
      }
      Mat::create(b,1,sVar1,*(Allocator **)(CONCAT44(in_stack_0000000c,keepdims) + 8));
      if (uVar26 == 0) {
        return -100;
      }
      plVar5 = *(long **)(CONCAT44(in_stack_0000000c,keepdims) + 0x10);
      uVar22 = sVar1 * (long)pMVar17 + 3 & 0xfffffffffffffffc;
      pMVar13 = (Mat *)(uVar22 + 4);
      if (plVar5 == (long *)0x0) {
        local_78.data = (Mat *)0x0;
        pMVar20 = (Mat *)0x10;
        iVar9 = posix_memalign(&local_78.data,0x10,(size_t)pMVar13);
        pMVar12 = (Mat *)0x0;
        if (iVar9 == 0) {
          pMVar12 = (Mat *)local_78.data;
        }
      }
      else {
        pMVar12 = (Mat *)(**(code **)(*plVar5 + 0x10))();
        pMVar20 = pMVar13;
      }
      *(undefined4 *)((long)&pMVar12->data + uVar22) = 1;
      if ((int)uVar26 < 1) {
        fVar29 = 0.0;
      }
      else {
        sVar1 = a->elemsize;
        sVar2 = a->cstep;
        pvVar11 = a->data;
        pMVar20 = (Mat *)0x0;
        do {
          fVar29 = 0.0;
          if (0 < (int)uVar27) {
            uVar24 = 0;
            do {
              fVar29 = fVar29 + ABS(*(float *)((long)pvVar11 + uVar24 * 4));
              uVar24 = uVar24 + 1;
            } while (uVar27 != uVar24);
          }
          *(float *)((long)&pMVar12->data + (long)pMVar20 * 4) = fVar29;
          pMVar20 = (Mat *)((long)&pMVar20->data + 1);
          pvVar11 = (void *)((long)pvVar11 + sVar1 * sVar2);
        } while (pMVar20 != pMVar17);
        fVar29 = 0.0;
        pMVar13 = (Mat *)0x0;
        do {
          fVar29 = fVar29 + *(float *)((long)&pMVar12->data + (long)pMVar13 * 4);
          pMVar13 = (Mat *)((long)&pMVar13->data + 1);
        } while (pMVar17 != pMVar13);
      }
      *(float *)b->data = fVar29;
      LOCK();
      piVar28 = (int *)((long)&pMVar12->data + uVar22);
      *piVar28 = *piVar28 + -1;
      UNLOCK();
      if (*piVar28 != 0) goto LAB_0014ba5a;
      if (plVar5 != (long *)0x0) {
        (**(code **)(*plVar5 + 0x18))();
        pMVar20 = pMVar12;
        goto LAB_0014ba5a;
      }
    }
    else {
      if (iVar9 != 2) {
        if (iVar9 != 1) goto LAB_0014ba5a;
        iVar9 = a->w;
        pMVar20 = (Mat *)0x1;
        Mat::create(b,1,sVar1,*(Allocator **)(lVar14 + 8));
        if ((long)iVar9 < 1) goto LAB_0014ba4a;
        fVar29 = 0.0;
        lVar14 = 0;
        do {
          fVar29 = fVar29 + ABS(*(float *)((long)a->data + lVar14 * 4));
          lVar14 = lVar14 + 1;
        } while (iVar9 != lVar14);
        goto LAB_0014ba4d;
      }
      uVar10 = a->w;
      pMVar13 = (Mat *)(ulong)uVar10;
      uVar7 = a->h;
      pMVar17 = (Mat *)(long)(int)uVar7;
      uVar22 = CONCAT71(in_register_00000011,reduce_w) & 0xffffffff;
      bVar18 = (byte)uVar22 ^ 1;
      if (bVar18 != 0 || !reduce_h) {
        bVar18 = bVar18 | reduce_h;
        if (bVar18 == 0) {
          pMVar20 = (Mat *)(ulong)uVar7;
          Mat::create(b,uVar7,sVar1,*(Allocator **)(lVar14 + 8));
          if (0 < (int)uVar7) {
            pvVar11 = a->data;
            iVar9 = a->w;
            pvVar15 = b->data;
            sVar1 = a->elemsize;
            pMVar20 = (Mat *)0x0;
            do {
              fVar29 = 0.0;
              if (0 < (int)uVar10) {
                pMVar12 = (Mat *)0x0;
                do {
                  fVar29 = fVar29 + ABS(*(float *)((long)pvVar11 + (long)pMVar12 * 4));
                  pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                } while (pMVar13 != pMVar12);
              }
              *(float *)((long)pvVar15 + (long)pMVar20 * 4) = fVar29;
              pMVar20 = (Mat *)((long)&pMVar20->data + 1);
              pvVar11 = (void *)((long)pvVar11 + (long)iVar9 * sVar1);
            } while (pMVar20 != pMVar17);
          }
        }
        else {
          pMVar20 = (Mat *)CONCAT71((int7)(uVar22 >> 8),bVar18);
          if (reduce_h && !reduce_w) {
            pMVar20 = pMVar13;
            Mat::create(b,uVar10,sVar1,*(Allocator **)(lVar14 + 8));
            uVar26 = b->c * (int)b->cstep;
            if (0 < (int)uVar26) {
              pMVar20 = (Mat *)0x0;
              memset(b->data,0,(ulong)uVar26 << 2);
            }
            if (0 < (int)uVar7) {
              pvVar11 = a->data;
              iVar9 = a->w;
              pvVar15 = b->data;
              sVar1 = a->elemsize;
              pMVar20 = (Mat *)0x0;
              do {
                if (0 < (int)uVar10) {
                  pMVar12 = (Mat *)0x0;
                  do {
                    *(float *)((long)pvVar15 + (long)pMVar12 * 4) =
                         ABS(*(float *)((long)pvVar11 + (long)pMVar12 * 4)) +
                         *(float *)((long)pvVar15 + (long)pMVar12 * 4);
                    pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                  } while (pMVar13 != pMVar12);
                }
                pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                pvVar11 = (void *)((long)pvVar11 + (long)iVar9 * sVar1);
              } while (pMVar20 != pMVar17);
            }
          }
        }
        goto LAB_0014ba5a;
      }
      Mat::create(b,1,sVar1,*(Allocator **)(lVar14 + 8));
      if (uVar7 == 0) {
        return -100;
      }
      plVar5 = *(long **)(lVar14 + 0x10);
      piVar28 = (int *)(sVar1 * (long)pMVar17 + 3 & 0xfffffffffffffffc);
      pMVar16 = (Mat *)(piVar28 + 1);
      if (plVar5 == (long *)0x0) {
        local_78.data = (Mat *)0x0;
        pMVar20 = (Mat *)0x10;
        iVar9 = posix_memalign(&local_78.data,0x10,(size_t)pMVar16);
        pMVar12 = (Mat *)local_78.data;
        if (iVar9 != 0) goto LAB_0014c1bc;
      }
      else {
        pMVar12 = (Mat *)(**(code **)(*plVar5 + 0x10))();
        pMVar20 = pMVar16;
      }
      *(undefined4 *)((long)&pMVar12->data + (long)piVar28) = 1;
      if ((int)uVar7 < 1) {
        fVar29 = 0.0;
      }
      else {
        pvVar11 = a->data;
        iVar9 = a->w;
        sVar1 = a->elemsize;
        pMVar20 = (Mat *)0x0;
        do {
          fVar29 = 0.0;
          if (0 < (int)uVar10) {
            pMVar16 = (Mat *)0x0;
            do {
              fVar29 = fVar29 + ABS(*(float *)((long)pvVar11 + (long)pMVar16 * 4));
              pMVar16 = (Mat *)((long)&pMVar16->data + 1);
            } while (pMVar13 != pMVar16);
          }
          *(float *)((long)&pMVar12->data + (long)pMVar20 * 4) = fVar29;
          pMVar20 = (Mat *)((long)&pMVar20->data + 1);
          pvVar11 = (void *)((long)pvVar11 + (long)iVar9 * sVar1);
        } while (pMVar20 != pMVar17);
        fVar29 = 0.0;
        pMVar13 = (Mat *)0x0;
        do {
          fVar29 = fVar29 + *(float *)((long)&pMVar12->data + (long)pMVar13 * 4);
          pMVar13 = (Mat *)((long)&pMVar13->data + 1);
        } while (pMVar17 != pMVar13);
      }
      *(float *)b->data = fVar29;
      LOCK();
      piVar28 = (int *)((long)&pMVar12->data + (long)piVar28);
      *piVar28 = *piVar28 + -1;
      UNLOCK();
      if (*piVar28 != 0) goto LAB_0014ba5a;
      if (plVar5 != (long *)0x0) {
        (**(code **)(*plVar5 + 0x18))(plVar5);
        pMVar20 = pMVar12;
        goto LAB_0014ba5a;
      }
    }
  }
  else if (iVar9 == 3) {
    uVar10 = a->w;
    lVar14 = (long)(int)uVar10;
    uVar7 = a->h;
    uVar22 = (ulong)uVar7;
    iVar9 = a->c;
    pMVar17 = (Mat *)(long)iVar9;
    uVar26 = uVar7 * uVar10;
    bVar6 = !reduce_h;
    pMVar20 = (Mat *)(CONCAT71(in_register_00000081,reduce_c) & 0xffffffff ^ 1);
    cVar19 = (char)pMVar20;
    if ((!reduce_w || bVar6) || cVar19 != '\0') {
      if ((reduce_w && !bVar6) && !reduce_c) {
        pMVar20 = (Mat *)0x1;
        Mat::create(b,1,1,iVar9,sVar1,*(Allocator **)(CONCAT44(in_stack_0000000c,keepdims) + 8));
        if (0 < iVar9) {
          pvVar11 = a->data;
          sVar1 = a->elemsize;
          pvVar15 = b->data;
          pMVar20 = (Mat *)(b->elemsize * b->cstep);
          sVar2 = a->cstep;
          pMVar13 = (Mat *)0x0;
          do {
            fVar29 = 0.0;
            if (0 < (int)uVar26) {
              uVar22 = 0;
              do {
                fVar29 = fVar29 + ABS(*(float *)((long)pvVar11 + uVar22 * 4));
                uVar22 = uVar22 + 1;
              } while (uVar26 != uVar22);
            }
            *(float *)((long)pvVar15 + (long)pMVar20 * (long)pMVar13) = fVar29;
            pMVar13 = (Mat *)((long)&pMVar13->data + 1);
            pvVar11 = (void *)((long)pvVar11 + sVar1 * sVar2);
          } while (pMVar13 != pMVar17);
        }
        goto LAB_0014ba5a;
      }
      pMVar13 = (Mat *)(ulong)uVar10;
      if ((reduce_w && !reduce_h) && !reduce_c) {
        pMVar20 = (Mat *)0x1;
        Mat::create(b,1,uVar7,iVar9,sVar1,*(Allocator **)(CONCAT44(in_stack_0000000c,keepdims) + 8))
        ;
        if (0 < iVar9) {
          pvVar11 = a->data;
          sVar1 = a->elemsize;
          pvVar15 = b->data;
          pMVar20 = (Mat *)(b->elemsize * b->cstep);
          sVar2 = a->cstep;
          pMVar12 = (Mat *)0x0;
          do {
            if (0 < (int)uVar7) {
              uVar24 = 0;
              pvVar23 = pvVar11;
              do {
                fVar29 = 0.0;
                if (0 < (int)uVar10) {
                  pMVar16 = (Mat *)0x0;
                  do {
                    fVar29 = fVar29 + ABS(*(float *)((long)pvVar23 + (long)pMVar16 * 4));
                    pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                  } while (pMVar13 != pMVar16);
                }
                *(float *)((long)pvVar15 + uVar24 * 4 + (long)pMVar20 * (long)pMVar12) = fVar29;
                uVar24 = uVar24 + 1;
                pvVar23 = (void *)((long)pvVar23 + lVar14 * 4);
              } while (uVar24 != uVar22);
            }
            pMVar12 = (Mat *)((long)&pMVar12->data + 1);
            pvVar11 = (void *)((long)pvVar11 + sVar1 * sVar2);
          } while (pMVar12 != pMVar17);
        }
        goto LAB_0014ba5a;
      }
      if ((reduce_w && !reduce_h) && cVar19 == '\0') {
        Mat::create(b,1,uVar7,1,sVar1,*(Allocator **)(CONCAT44(in_stack_0000000c,keepdims) + 8));
        local_78.elemsize._0_4_ = 0;
        local_78.elemsize._4_4_ = 0;
        local_78.elempack = 0;
        local_78.data = (Mat *)0x0;
        local_78.refcount._0_4_ = 0;
        local_78.refcount._4_4_ = 0;
        local_78.allocator = (Allocator *)0x0;
        local_78.dims = 0;
        local_78.w = 0;
        local_78.h = 0;
        local_78.c = 0;
        local_78.cstep = 0;
        Mat::create(&local_78,1,uVar7,iVar9,sVar1,
                    *(Allocator **)(CONCAT44(in_stack_0000000c,keepdims) + 0x10));
        sVar1 = local_78.cstep;
        pMVar20 = (Mat *)local_78.data;
        pMVar12 = (Mat *)0xffffff9c;
        if (((Mat *)local_78.data != (Mat *)0x0) && (local_78.cstep * (long)local_78.c != 0)) {
          uVar26 = (int)local_78.cstep * local_78.c;
          if (0 < (int)uVar26) {
            memset(local_78.data,0,(ulong)uVar26 << 2);
          }
          if (0 < iVar9) {
            pvVar11 = a->data;
            sVar2 = a->elemsize;
            sVar3 = a->cstep;
            pMVar12 = (Mat *)0x0;
            do {
              if (0 < (int)uVar7) {
                uVar24 = 0;
                pvVar15 = pvVar11;
                do {
                  fVar29 = 0.0;
                  if (0 < (int)uVar10) {
                    pMVar16 = (Mat *)0x0;
                    do {
                      fVar29 = fVar29 + ABS(*(float *)((long)pvVar15 + (long)pMVar16 * 4));
                      pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                    } while (pMVar13 != pMVar16);
                  }
                  *(float *)((long)&pMVar20->data +
                            uVar24 * 4 +
                            CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize) * sVar1
                            * (long)pMVar12) = fVar29;
                  uVar24 = uVar24 + 1;
                  pvVar15 = (void *)((long)pvVar15 + lVar14 * 4);
                } while (uVar24 != uVar22);
              }
              pMVar12 = (Mat *)((long)&pMVar12->data + 1);
              pvVar11 = (void *)((long)pvVar11 + sVar2 * sVar3);
            } while (pMVar12 != pMVar17);
          }
          uVar10 = b->c * (int)b->cstep;
          if (0 < (int)uVar10) {
            memset(b->data,0,(ulong)uVar10 << 2);
          }
          if (0 < iVar9) {
            pvVar11 = b->data;
            pMVar13 = (Mat *)0x0;
            do {
              if (0 < (int)uVar7) {
                uVar24 = 0;
                do {
                  *(float *)((long)pvVar11 + uVar24 * 4) =
                       *(float *)((long)&pMVar20->data + uVar24 * 4) +
                       *(float *)((long)pvVar11 + uVar24 * 4);
                  uVar24 = uVar24 + 1;
                } while (uVar22 != uVar24);
              }
              pMVar13 = (Mat *)((long)&pMVar13->data + 1);
              pMVar20 = (Mat *)((long)&pMVar20->data +
                               sVar1 * CONCAT44(local_78.elemsize._4_4_,
                                                (undefined4)local_78.elemsize));
            } while (pMVar13 != pMVar17);
          }
LAB_0014c8ff:
          pMVar12 = (Mat *)0x0;
        }
      }
      else {
        if ((bVar6 || reduce_w) || cVar19 != '\0') {
          if ((reduce_w || reduce_h) || cVar19 != '\0') {
            if ((!bVar6 && !reduce_w) && !reduce_c) {
              pMVar20 = (Mat *)(ulong)uVar10;
              Mat::create(b,uVar10,1,iVar9,sVar1,
                          *(Allocator **)(CONCAT44(in_stack_0000000c,keepdims) + 8));
              sVar1 = b->cstep;
              uVar26 = b->c * (int)sVar1;
              if (0 < (int)uVar26) {
                pMVar20 = (Mat *)0x0;
                memset(b->data,0,(ulong)uVar26 << 2);
              }
              if (0 < iVar9) {
                pvVar11 = a->data;
                sVar2 = a->elemsize;
                pvVar15 = b->data;
                sVar3 = a->cstep;
                pMVar20 = (Mat *)((long)(int)uVar10 * 4);
                sVar4 = b->elemsize;
                pMVar12 = (Mat *)0x0;
                do {
                  if (0 < (int)uVar7) {
                    uVar26 = 0;
                    pvVar23 = pvVar11;
                    do {
                      if (0 < (int)uVar10) {
                        pMVar16 = (Mat *)0x0;
                        do {
                          *(float *)((long)pvVar15 + (long)pMVar16 * 4) =
                               ABS(*(float *)((long)pvVar23 + (long)pMVar16 * 4)) +
                               *(float *)((long)pvVar15 + (long)pMVar16 * 4);
                          pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                        } while (pMVar13 != pMVar16);
                      }
                      uVar26 = uVar26 + 1;
                      pvVar23 = (void *)((long)&pMVar20->data + (long)pvVar23);
                    } while (uVar26 != uVar7);
                  }
                  pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                  pvVar11 = (void *)((long)pvVar11 + sVar2 * sVar3);
                  pvVar15 = (void *)((long)pvVar15 + sVar1 * sVar4);
                } while (pMVar12 != pMVar17);
              }
            }
          }
          else {
            Mat::create(b,uVar10,uVar7,1,sVar1,
                        *(Allocator **)(CONCAT44(in_stack_0000000c,keepdims) + 8));
            uVar10 = b->c * (int)b->cstep;
            if (0 < (int)uVar10) {
              pMVar13 = (Mat *)0x0;
              memset(b->data,0,(ulong)uVar10 << 2);
            }
            pMVar20 = pMVar13;
            if (0 < iVar9) {
              pvVar11 = a->data;
              sVar1 = a->elemsize;
              sVar2 = a->cstep;
              pvVar15 = b->data;
              pMVar20 = (Mat *)(ulong)uVar26;
              pMVar13 = (Mat *)0x0;
              do {
                if (0 < (int)uVar26) {
                  pMVar12 = (Mat *)0x0;
                  do {
                    *(float *)((long)pvVar15 + (long)pMVar12 * 4) =
                         ABS(*(float *)((long)pvVar11 + (long)pMVar12 * 4)) +
                         *(float *)((long)pvVar15 + (long)pMVar12 * 4);
                    pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                  } while (pMVar20 != pMVar12);
                }
                pMVar13 = (Mat *)((long)&pMVar13->data + 1);
                pvVar11 = (void *)((long)pvVar11 + sVar1 * sVar2);
              } while (pMVar13 != pMVar17);
            }
          }
          goto LAB_0014ba5a;
        }
        Mat::create(b,uVar10,1,1,sVar1,*(Allocator **)(CONCAT44(in_stack_0000000c,keepdims) + 8));
        local_78.elemsize._0_4_ = 0;
        local_78.elemsize._4_4_ = 0;
        local_78.elempack = 0;
        local_78.data = (Mat *)0x0;
        local_78.refcount._0_4_ = 0;
        local_78.refcount._4_4_ = 0;
        local_78.allocator = (Allocator *)0x0;
        local_78.dims = 0;
        local_78.w = 0;
        local_78.h = 0;
        local_78.c = 0;
        local_78.cstep = 0;
        Mat::create(&local_78,uVar10,1,iVar9,sVar1,
                    *(Allocator **)(CONCAT44(in_stack_0000000c,keepdims) + 0x10));
        sVar1 = local_78.cstep;
        pMVar20 = (Mat *)local_78.data;
        pMVar12 = (Mat *)0xffffff9c;
        if (((Mat *)local_78.data != (Mat *)0x0) && (local_78.cstep * (long)local_78.c != 0)) {
          uVar26 = (int)local_78.cstep * local_78.c;
          if (0 < (int)uVar26) {
            memset(local_78.data,0,(ulong)uVar26 << 2);
          }
          if (0 < iVar9) {
            pvVar11 = a->data;
            sVar2 = a->elemsize;
            sVar3 = a->cstep;
            pMVar16 = (Mat *)0x0;
            pMVar12 = pMVar20;
            do {
              if (0 < (int)uVar7) {
                uVar26 = 0;
                pvVar15 = pvVar11;
                do {
                  if (0 < (int)uVar10) {
                    pMVar25 = (Mat *)0x0;
                    do {
                      *(float *)((long)&pMVar12->data + (long)pMVar25 * 4) =
                           ABS(*(float *)((long)pvVar15 + (long)pMVar25 * 4)) +
                           *(float *)((long)&pMVar12->data + (long)pMVar25 * 4);
                      pMVar25 = (Mat *)((long)&pMVar25->data + 1);
                    } while (pMVar13 != pMVar25);
                  }
                  uVar26 = uVar26 + 1;
                  pvVar15 = (void *)((long)pvVar15 + lVar14 * 4);
                } while (uVar26 != uVar7);
              }
              pMVar16 = (Mat *)((long)&pMVar16->data + 1);
              pvVar11 = (void *)((long)pvVar11 + sVar2 * sVar3);
              pMVar12 = (Mat *)((long)&pMVar12->data +
                               CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize) *
                               sVar1);
            } while (pMVar16 != pMVar17);
          }
          uVar7 = b->c * (int)b->cstep;
          if (0 < (int)uVar7) {
            memset(b->data,0,(ulong)uVar7 << 2);
          }
          if (0 < iVar9) {
            pvVar11 = b->data;
            pMVar12 = (Mat *)0x0;
            do {
              if (0 < (int)uVar10) {
                pMVar16 = (Mat *)0x0;
                do {
                  *(float *)((long)pvVar11 + (long)pMVar16 * 4) =
                       *(float *)((long)&pMVar20->data + (long)pMVar16 * 4) +
                       *(float *)((long)pvVar11 + (long)pMVar16 * 4);
                  pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                } while (pMVar13 != pMVar16);
              }
              pMVar12 = (Mat *)((long)&pMVar12->data + 1);
              pMVar20 = (Mat *)((long)&pMVar20->data +
                               sVar1 * CONCAT44(local_78.elemsize._4_4_,
                                                (undefined4)local_78.elemsize));
            } while (pMVar12 != pMVar17);
          }
          goto LAB_0014c8ff;
        }
      }
LAB_0014c901:
      pMVar20 = pMVar12;
      Mat::~Mat(&local_78);
      if ((int)pMVar12 != 0) {
        return -100;
      }
      goto LAB_0014ba5a;
    }
    Mat::create(b,1,1,1,sVar1,*(Allocator **)(CONCAT44(in_stack_0000000c,keepdims) + 8));
    if (iVar9 == 0) {
      return -100;
    }
    plVar5 = *(long **)(CONCAT44(in_stack_0000000c,keepdims) + 0x10);
    uVar22 = sVar1 * (long)pMVar17 + 3 & 0xfffffffffffffffc;
    pMVar13 = (Mat *)(uVar22 + 4);
    if (plVar5 == (long *)0x0) {
      local_78.data = (Mat *)0x0;
      pMVar20 = (Mat *)0x10;
      iVar8 = posix_memalign(&local_78.data,0x10,(size_t)pMVar13);
      pMVar12 = (Mat *)0x0;
      if (iVar8 == 0) {
        pMVar12 = (Mat *)local_78.data;
      }
    }
    else {
      pMVar12 = (Mat *)(**(code **)(*plVar5 + 0x10))();
      pMVar20 = pMVar13;
    }
    *(undefined4 *)((long)&pMVar12->data + uVar22) = 1;
    if (iVar9 < 1) {
      fVar29 = 0.0;
    }
    else {
      sVar1 = a->elemsize;
      sVar2 = a->cstep;
      pvVar11 = a->data;
      pMVar20 = (Mat *)0x0;
      do {
        fVar29 = 0.0;
        if (0 < (int)uVar26) {
          uVar24 = 0;
          do {
            fVar29 = fVar29 + ABS(*(float *)((long)pvVar11 + uVar24 * 4));
            uVar24 = uVar24 + 1;
          } while (uVar26 != uVar24);
        }
        *(float *)((long)&pMVar12->data + (long)pMVar20 * 4) = fVar29;
        pMVar20 = (Mat *)((long)&pMVar20->data + 1);
        pvVar11 = (void *)((long)pvVar11 + sVar1 * sVar2);
      } while (pMVar20 != pMVar17);
      fVar29 = 0.0;
      pMVar13 = (Mat *)0x0;
      do {
        fVar29 = fVar29 + *(float *)((long)&pMVar12->data + (long)pMVar13 * 4);
        pMVar13 = (Mat *)((long)&pMVar13->data + 1);
      } while (pMVar17 != pMVar13);
    }
    *(float *)b->data = fVar29;
    LOCK();
    piVar28 = (int *)((long)&pMVar12->data + uVar22);
    *piVar28 = *piVar28 + -1;
    UNLOCK();
    if (*piVar28 != 0) goto LAB_0014ba5a;
    if (plVar5 != (long *)0x0) {
      (**(code **)(*plVar5 + 0x18))();
      pMVar20 = pMVar12;
      goto LAB_0014ba5a;
    }
  }
  else {
    if (iVar9 != 2) {
      if (iVar9 != 1) goto LAB_0014ba5a;
      iVar9 = a->w;
      pMVar20 = (Mat *)0x1;
      Mat::create(b,1,sVar1,*(Allocator **)(lVar14 + 8));
      if ((long)iVar9 < 1) {
LAB_0014ba4a:
        fVar29 = 0.0;
      }
      else {
        fVar29 = 0.0;
        lVar14 = 0;
        do {
          fVar29 = fVar29 + ABS(*(float *)((long)a->data + lVar14 * 4));
          lVar14 = lVar14 + 1;
        } while (iVar9 != lVar14);
      }
LAB_0014ba4d:
      *(float *)b->data = fVar29;
      goto LAB_0014ba5a;
    }
    uVar10 = a->w;
    pMVar13 = (Mat *)(ulong)uVar10;
    iVar9 = a->h;
    pMVar17 = (Mat *)(long)iVar9;
    uVar22 = CONCAT71(in_register_00000011,reduce_w) & 0xffffffff;
    bVar18 = (byte)uVar22 ^ 1;
    if (bVar18 != 0 || !reduce_h) {
      bVar18 = bVar18 | reduce_h;
      if (bVar18 == 0) {
        pMVar20 = (Mat *)0x1;
        Mat::create(b,1,iVar9,sVar1,*(Allocator **)(lVar14 + 8));
        if (0 < iVar9) {
          pvVar11 = a->data;
          iVar9 = a->w;
          pvVar15 = b->data;
          sVar1 = a->elemsize;
          pMVar20 = (Mat *)0x0;
          do {
            fVar29 = 0.0;
            if (0 < (int)uVar10) {
              pMVar12 = (Mat *)0x0;
              do {
                fVar29 = fVar29 + ABS(*(float *)((long)pvVar11 + (long)pMVar12 * 4));
                pMVar12 = (Mat *)((long)&pMVar12->data + 1);
              } while (pMVar13 != pMVar12);
            }
            *(float *)((long)pvVar15 + (long)pMVar20 * 4) = fVar29;
            pMVar20 = (Mat *)((long)&pMVar20->data + 1);
            pvVar11 = (void *)((long)pvVar11 + (long)iVar9 * sVar1);
          } while (pMVar20 != pMVar17);
        }
      }
      else {
        pMVar20 = (Mat *)CONCAT71((int7)(uVar22 >> 8),bVar18);
        if (reduce_h && !reduce_w) {
          pMVar20 = pMVar13;
          Mat::create(b,uVar10,1,sVar1,*(Allocator **)(lVar14 + 8));
          uVar7 = b->c * (int)b->cstep;
          if (0 < (int)uVar7) {
            pMVar20 = (Mat *)0x0;
            memset(b->data,0,(ulong)uVar7 << 2);
          }
          if (0 < iVar9) {
            pvVar11 = a->data;
            iVar9 = a->w;
            pvVar15 = b->data;
            sVar1 = a->elemsize;
            pMVar20 = (Mat *)0x0;
            do {
              if (0 < (int)uVar10) {
                pMVar12 = (Mat *)0x0;
                do {
                  *(float *)((long)pvVar15 + (long)pMVar12 * 4) =
                       ABS(*(float *)((long)pvVar11 + (long)pMVar12 * 4)) +
                       *(float *)((long)pvVar15 + (long)pMVar12 * 4);
                  pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                } while (pMVar13 != pMVar12);
              }
              pMVar20 = (Mat *)((long)&pMVar20->data + 1);
              pvVar11 = (void *)((long)pvVar11 + (long)iVar9 * sVar1);
            } while (pMVar20 != pMVar17);
          }
        }
      }
      goto LAB_0014ba5a;
    }
    Mat::create(b,1,1,sVar1,*(Allocator **)(lVar14 + 8));
    if (iVar9 == 0) {
      return -100;
    }
    plVar5 = *(long **)(lVar14 + 0x10);
    piVar28 = (int *)(sVar1 * (long)pMVar17 + 3 & 0xfffffffffffffffc);
    pMVar16 = (Mat *)(piVar28 + 1);
    if (plVar5 == (long *)0x0) {
      local_78.data = (Mat *)0x0;
      pMVar20 = (Mat *)0x10;
      iVar8 = posix_memalign(&local_78.data,0x10,(size_t)pMVar16);
      pMVar12 = (Mat *)local_78.data;
      if (iVar8 != 0) {
LAB_0014c1bc:
        LOCK();
        *piVar28 = *piVar28 + -1;
        UNLOCK();
        return -100;
      }
    }
    else {
      pMVar12 = (Mat *)(**(code **)(*plVar5 + 0x10))();
      pMVar20 = pMVar16;
    }
    *(undefined4 *)((long)&pMVar12->data + (long)piVar28) = 1;
    if (iVar9 < 1) {
      fVar29 = 0.0;
    }
    else {
      pvVar11 = a->data;
      iVar9 = a->w;
      sVar1 = a->elemsize;
      pMVar20 = (Mat *)0x0;
      do {
        fVar29 = 0.0;
        if (0 < (int)uVar10) {
          pMVar16 = (Mat *)0x0;
          do {
            fVar29 = fVar29 + ABS(*(float *)((long)pvVar11 + (long)pMVar16 * 4));
            pMVar16 = (Mat *)((long)&pMVar16->data + 1);
          } while (pMVar13 != pMVar16);
        }
        *(float *)((long)&pMVar12->data + (long)pMVar20 * 4) = fVar29;
        pMVar20 = (Mat *)((long)&pMVar20->data + 1);
        pvVar11 = (void *)((long)pvVar11 + (long)iVar9 * sVar1);
      } while (pMVar20 != pMVar17);
      fVar29 = 0.0;
      pMVar13 = (Mat *)0x0;
      do {
        fVar29 = fVar29 + *(float *)((long)&pMVar12->data + (long)pMVar13 * 4);
        pMVar13 = (Mat *)((long)&pMVar13->data + 1);
      } while (pMVar17 != pMVar13);
    }
    *(float *)b->data = fVar29;
    LOCK();
    piVar28 = (int *)((long)&pMVar12->data + (long)piVar28);
    *piVar28 = *piVar28 + -1;
    UNLOCK();
    if (*piVar28 != 0) goto LAB_0014ba5a;
    if (plVar5 != (long *)0x0) {
      (**(code **)(*plVar5 + 0x18))(plVar5);
      pMVar20 = pMVar12;
      goto LAB_0014ba5a;
    }
  }
  free(pMVar12);
LAB_0014ba5a:
  if (1.1920929e-07 < ABS(v0 + -1.0)) {
    reduction_post_process<ncnn::post_process_identity<float>>(b,v0,(Option *)pMVar20);
  }
  return 0;
}

Assistant:

static int reduction(const Mat& a, Mat& b, float v0, bool reduce_w, bool reduce_h, bool reduce_c, bool post_process, float coeff, int keepdims, const Option& opt)
{
    int ret;
    if (keepdims)
        ret = reduction_op_keepdims<Op, Op2>(a, b, v0, reduce_w, reduce_h, reduce_c, opt);
    else
        ret = reduction_op<Op, Op2>(a, b, v0, reduce_w, reduce_h, reduce_c, opt);
    if (ret != 0)
        return -100;

    if (post_process || fabs(coeff - 1.f) > FLT_EPSILON)
    {
        ret = reduction_post_process<Op3>(b, coeff, opt);
        if (ret != 0)
            return -100;
    }
    return ret;
}